

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O3

void __thiscall
icu_63::number::impl::DecimalQuantity::roundToMagnitude
          (DecimalQuantity *this,int32_t magnitude,RoundingMode roundingMode,UErrorCode *status)

{
  int8_t *piVar1;
  bool bVar2;
  int32_t iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  char cVar9;
  int iVar10;
  ulong uVar11;
  byte bVar12;
  byte bVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  bool bVar17;
  
  iVar10 = this->scale;
  uVar4 = magnitude - iVar10;
  uVar11 = (ulong)uVar4;
  if (magnitude < (int)uVar4) {
    uVar11 = 0x80000000;
  }
  if (iVar10 < 1) {
    uVar11 = (ulong)uVar4;
  }
  uVar16 = uVar11;
  if ((int)uVar4 < magnitude) {
    uVar16 = 0x7fffffff;
  }
  if (-1 < iVar10) {
    uVar16 = uVar11;
  }
  bVar2 = (int)uVar16 < 1;
  bVar17 = this->isApproximate == '\0';
  if (bVar2 && bVar17) {
    return;
  }
LAB_00215fb1:
  uVar4 = (uint)uVar16;
  iVar10 = this->precision;
  if ((long)iVar10 == 0) {
    return;
  }
  uVar15 = uVar4 - 1;
  if (this->usingBytes == true) {
    if ((int)uVar15 < iVar10 && -1 < (int)uVar15) {
      uVar14 = (uint)(byte)(this->fBCD).bcdBytes.ptr[uVar15];
    }
    else {
      uVar14 = 0;
    }
    if ((int)uVar4 < iVar10 && -1 < (int)uVar4) {
      uVar5 = (uint)(byte)(this->fBCD).bcdBytes.ptr[uVar16];
    }
    else {
      uVar5 = 0;
    }
  }
  else {
    uVar5 = 0;
    uVar14 = (uint)((byte)((this->fBCD).bcdLong >> ((char)uVar15 * '\x04' & 0x3fU)) & 0xf);
    if (0xf < uVar15) {
      uVar14 = uVar5;
    }
    if (uVar4 < 0x10) {
      uVar5 = (uint)((this->fBCD).bcdLong >> ((char)uVar16 * '\x04' & 0x3fU)) & 0xffffff0f;
    }
  }
  cVar9 = (char)uVar14;
  if (!bVar17) {
    iVar6 = uVar4 - 2;
    if ((int)uVar4 < -0x7ffffffe) {
      iVar6 = -0x80000000;
    }
    iVar3 = uprv_max_63(0,iVar10 + -0xe);
    switch(uVar14) {
    case 0:
      iVar10 = this->precision;
      iVar8 = 1;
      if (iVar6 < iVar3) goto LAB_002161c7;
      uVar14 = 0x80000002;
      if (-0x7ffffffe < (int)uVar4) {
        uVar14 = uVar4;
      }
      piVar1 = (this->fBCD).bcdBytes.ptr;
      iVar6 = uVar14 * 4 + -8;
      uVar14 = uVar14 - 1;
      do {
        uVar14 = uVar14 - 1;
        if (this->usingBytes == false) {
          if (uVar14 < 0x10) {
            bVar13 = (byte)((ulong)piVar1 >> ((byte)iVar6 & 0x3f)) & 0xf;
            goto LAB_00216103;
          }
        }
        else if ((int)uVar14 < iVar10 && -1 < (int)uVar14) {
          bVar13 = piVar1[uVar14];
LAB_00216103:
          if (bVar13 != 0) goto LAB_002162f2;
        }
        iVar6 = iVar6 + -4;
      } while (iVar3 < (int)uVar14);
LAB_002162da:
      bVar12 = 0;
      bVar13 = 0;
      break;
    default:
      iVar8 = (uint)('\x04' < cVar9) * 2 + 1;
      iVar10 = this->precision;
      bVar13 = 1;
      bVar12 = 0;
      break;
    case 4:
      iVar10 = this->precision;
      bVar13 = 1;
      if (iVar6 < iVar3) goto LAB_002161b2;
      uVar14 = 0x80000002;
      if (-0x7ffffffe < (int)uVar4) {
        uVar14 = uVar4;
      }
      piVar1 = (this->fBCD).bcdBytes.ptr;
      iVar6 = uVar14 * 4 + -8;
      uVar14 = uVar14 - 1;
      do {
        uVar14 = uVar14 - 1;
        if (this->usingBytes == false) {
          if (uVar14 < 0x10) {
            bVar12 = (byte)((ulong)piVar1 >> ((byte)iVar6 & 0x3f)) & 0xf;
            goto LAB_00216257;
          }
LAB_002162e6:
          iVar8 = 1;
          goto LAB_002162f2;
        }
        bVar12 = 0;
        if (((int)uVar14 < 0) || (iVar10 <= (int)uVar14)) {
          iVar8 = 1;
          goto LAB_002162f5;
        }
        bVar12 = piVar1[uVar14];
LAB_00216257:
        if (bVar12 != 9) goto LAB_002162e6;
        iVar6 = iVar6 + -4;
      } while (iVar3 < (int)uVar14);
LAB_00216269:
      iVar8 = 2;
      bVar13 = 1;
      bVar12 = 1;
      break;
    case 5:
      iVar10 = this->precision;
      if (iVar3 <= iVar6) {
        uVar14 = 0x80000002;
        if (-0x7ffffffe < (int)uVar4) {
          uVar14 = uVar4;
        }
        piVar1 = (this->fBCD).bcdBytes.ptr;
        iVar6 = uVar14 * 4 + -8;
        uVar14 = uVar14 - 1;
        do {
          uVar14 = uVar14 - 1;
          if (this->usingBytes == false) {
            if (uVar14 < 0x10) {
              bVar13 = (byte)((ulong)piVar1 >> ((byte)iVar6 & 0x3f)) & 0xf;
              goto LAB_0021618d;
            }
          }
          else if ((int)uVar14 < iVar10 && -1 < (int)uVar14) {
            bVar13 = piVar1[uVar14];
LAB_0021618d:
            if (bVar13 != 0) {
              iVar8 = 3;
              goto LAB_002162f2;
            }
          }
          iVar6 = iVar6 + -4;
        } while (iVar3 < (int)uVar14);
        goto LAB_00216269;
      }
LAB_002161b2:
      bVar13 = 1;
      iVar8 = 2;
      bVar12 = 1;
      break;
    case 9:
      iVar10 = this->precision;
      iVar8 = 3;
      if (iVar3 <= iVar6) {
        uVar14 = 0x80000002;
        if (-0x7ffffffe < (int)uVar4) {
          uVar14 = uVar4;
        }
        piVar1 = (this->fBCD).bcdBytes.ptr;
        iVar6 = uVar14 * 4 + -8;
        uVar14 = uVar14 - 1;
        do {
          uVar14 = uVar14 - 1;
          if (this->usingBytes == false) {
            if (0xf < uVar14) goto LAB_002162f2;
            bVar13 = (byte)((ulong)piVar1 >> ((byte)iVar6 & 0x3f)) & 0xf;
          }
          else {
            bVar12 = 0;
            bVar13 = 1;
            if (((int)uVar14 < 0) || (iVar10 <= (int)uVar14)) goto LAB_002162f5;
            bVar13 = piVar1[uVar14];
          }
          if (bVar13 != 9) goto LAB_002162f2;
          iVar6 = iVar6 + -4;
        } while (iVar3 < (int)uVar14);
        goto LAB_002162da;
      }
LAB_002161c7:
      bVar12 = 0;
      bVar13 = 0;
    }
    goto LAB_002162f5;
  }
  iVar8 = 1;
  if ((cVar9 < '\x05') || (iVar8 = 3, cVar9 != '\x05')) goto LAB_0021640e;
  uVar15 = 0x80000000;
  if (-0x7fffffff < (int)uVar4) {
    uVar15 = uVar4 - 2;
  }
  if ((int)uVar15 < 0) goto LAB_00216409;
  piVar1 = (this->fBCD).bcdBytes.ptr;
  lVar7 = (ulong)uVar15 * 4;
  uVar11 = (ulong)uVar15;
  goto LAB_002163d5;
LAB_002162f2:
  bVar13 = 1;
  bVar12 = 0;
LAB_002162f5:
  if ((((bool)(bVar13 | UNUM_ROUND_UP < roundingMode)) &&
      (!(bool)(UNUM_ROUND_UP < roundingMode & bVar12))) && (iVar10 + -0xe <= (int)uVar15)) {
    this->isApproximate = '\0';
    this->origDouble = 0.0;
    this->origDelta = 0;
    if (bVar2) {
      return;
    }
    goto LAB_0021640e;
  }
  convertToAccurateDouble(this);
  iVar10 = this->scale;
  uVar15 = magnitude - iVar10;
  uVar4 = uVar15;
  if (magnitude < (int)uVar15) {
    uVar4 = 0x80000000;
  }
  if (iVar10 < 1) {
    uVar4 = uVar15;
  }
  uVar16 = (ulong)uVar4;
  if ((int)uVar15 < magnitude) {
    uVar16 = 0x7fffffff;
  }
  if (-1 < iVar10) {
    uVar16 = (ulong)uVar4;
  }
  bVar2 = (int)uVar16 < 1;
  bVar17 = this->isApproximate == '\0';
  if (bVar2 && bVar17) {
    return;
  }
  goto LAB_00215fb1;
LAB_0021650f:
  shiftRight(this,(int32_t)uVar11);
  goto LAB_00216517;
LAB_002163d5:
  do {
    if (this->usingBytes == false) {
      if (uVar11 < 0x10) {
        bVar13 = (byte)((ulong)piVar1 >> ((byte)lVar7 & 0x3f)) & 0xf;
        goto LAB_002163f4;
      }
    }
    else if ((long)uVar11 < (long)iVar10) {
      bVar13 = piVar1[uVar11];
LAB_002163f4:
      if (bVar13 != 0) goto LAB_0021640e;
    }
    lVar7 = lVar7 + -4;
    bVar2 = 0 < (long)uVar11;
    uVar11 = uVar11 - 1;
  } while (bVar2);
LAB_00216409:
  iVar8 = 2;
LAB_0021640e:
  if (UNUM_ROUND_HALFUP < roundingMode) {
LAB_002164a4:
    *status = U_FORMAT_INEXACT_ERROR;
    return;
  }
  switch(roundingMode) {
  case UNUM_ROUND_CEILING:
    bVar12 = this->flags & 1;
    break;
  case UNUM_ROUND_FLOOR:
    bVar12 = (this->flags & 1U) == 0;
    break;
  case UNUM_ROUND_DOWN:
switchD_0021642f_caseD_2:
    bVar12 = 1;
    break;
  case UNUM_ROUND_UP:
switchD_0021642f_caseD_3:
    bVar12 = 0;
    break;
  case UNUM_FOUND_HALFEVEN:
    bVar12 = (uVar5 & 1) == 0;
    if (iVar8 == 3) goto switchD_0021642f_caseD_3;
    if (iVar8 != 2) {
      if (iVar8 != 1) goto LAB_002164a4;
      goto switchD_0021642f_caseD_2;
    }
    break;
  case UNUM_ROUND_HALFDOWN:
    if (2 < iVar8 - 1U) goto LAB_002164a4;
    bVar13 = (byte)(iVar8 - 1U);
    bVar12 = 3;
    goto LAB_0021647f;
  case UNUM_ROUND_HALFUP:
    if (2 < iVar8 - 1U) goto LAB_002164a4;
    bVar13 = (byte)(iVar8 - 1U);
    bVar12 = 1;
LAB_0021647f:
    bVar12 = bVar12 >> (bVar13 & 7);
  }
  if (U_ZERO_ERROR < *status) {
    return;
  }
  if ((int)uVar4 < iVar10) {
    shiftRight(this,uVar4);
  }
  else {
    setBcdToZero(this);
    this->scale = magnitude;
  }
  if ((bVar12 & 1) == 0) {
    if ((char)uVar5 == '\t') {
      piVar1 = (this->fBCD).bcdBytes.ptr;
      bVar13 = 0;
      uVar11 = 0;
      do {
        if (this->usingBytes == false) {
          if (0xf < uVar11) goto LAB_0021650f;
          bVar12 = (byte)((ulong)piVar1 >> (bVar13 & 0x3f)) & 0xf;
        }
        else {
          if ((long)this->precision <= (long)uVar11) goto LAB_0021650f;
          bVar12 = piVar1[uVar11];
        }
        if (bVar12 != 9) goto LAB_0021650f;
        uVar11 = uVar11 + 1;
        bVar13 = bVar13 + 4;
      } while( true );
    }
LAB_00216517:
    if (this->usingBytes == true) {
      if (this->precision < 1) {
        cVar9 = '\x01';
      }
      else {
        cVar9 = *(this->fBCD).bcdBytes.ptr + '\x01';
      }
      ensureCapacity(this,1);
      *(this->fBCD).bcdBytes.ptr = cVar9;
    }
    else {
      (this->fBCD).bcdLong =
           (this->fBCD).bcdLong & 0xfffffffffffffff0 | (ulong)((uint)(this->fBCD).bcdLong & 0xf) + 1
      ;
    }
    this->precision = this->precision + 1;
  }
  compact(this);
  return;
}

Assistant:

void DecimalQuantity::roundToMagnitude(int32_t magnitude, RoundingMode roundingMode, UErrorCode& status) {
    // The position in the BCD at which rounding will be performed; digits to the right of position
    // will be rounded away.
    // TODO: Andy: There was a test failure because of integer overflow here. Should I do
    // "safe subtraction" everywhere in the code?  What's the nicest way to do it?
    int position = safeSubtract(magnitude, scale);

    if (position <= 0 && !isApproximate) {
        // All digits are to the left of the rounding magnitude.
    } else if (precision == 0) {
        // No rounding for zero.
    } else {
        // Perform rounding logic.
        // "leading" = most significant digit to the right of rounding
        // "trailing" = least significant digit to the left of rounding
        int8_t leadingDigit = getDigitPos(safeSubtract(position, 1));
        int8_t trailingDigit = getDigitPos(position);

        // Compute which section of the number we are in.
        // EDGE means we are at the bottom or top edge, like 1.000 or 1.999 (used by doubles)
        // LOWER means we are between the bottom edge and the midpoint, like 1.391
        // MIDPOINT means we are exactly in the middle, like 1.500
        // UPPER means we are between the midpoint and the top edge, like 1.916
        roundingutils::Section section = roundingutils::SECTION_MIDPOINT;
        if (!isApproximate) {
            if (leadingDigit < 5) {
                section = roundingutils::SECTION_LOWER;
            } else if (leadingDigit > 5) {
                section = roundingutils::SECTION_UPPER;
            } else {
                for (int p = safeSubtract(position, 2); p >= 0; p--) {
                    if (getDigitPos(p) != 0) {
                        section = roundingutils::SECTION_UPPER;
                        break;
                    }
                }
            }
        } else {
            int32_t p = safeSubtract(position, 2);
            int32_t minP = uprv_max(0, precision - 14);
            if (leadingDigit == 0) {
                section = roundingutils::SECTION_LOWER_EDGE;
                for (; p >= minP; p--) {
                    if (getDigitPos(p) != 0) {
                        section = roundingutils::SECTION_LOWER;
                        break;
                    }
                }
            } else if (leadingDigit == 4) {
                for (; p >= minP; p--) {
                    if (getDigitPos(p) != 9) {
                        section = roundingutils::SECTION_LOWER;
                        break;
                    }
                }
            } else if (leadingDigit == 5) {
                for (; p >= minP; p--) {
                    if (getDigitPos(p) != 0) {
                        section = roundingutils::SECTION_UPPER;
                        break;
                    }
                }
            } else if (leadingDigit == 9) {
                section = roundingutils::SECTION_UPPER_EDGE;
                for (; p >= minP; p--) {
                    if (getDigitPos(p) != 9) {
                        section = roundingutils::SECTION_UPPER;
                        break;
                    }
                }
            } else if (leadingDigit < 5) {
                section = roundingutils::SECTION_LOWER;
            } else {
                section = roundingutils::SECTION_UPPER;
            }

            bool roundsAtMidpoint = roundingutils::roundsAtMidpoint(roundingMode);
            if (safeSubtract(position, 1) < precision - 14 ||
                (roundsAtMidpoint && section == roundingutils::SECTION_MIDPOINT) ||
                (!roundsAtMidpoint && section < 0 /* i.e. at upper or lower edge */)) {
                // Oops! This means that we have to get the exact representation of the double, because
                // the zone of uncertainty is along the rounding boundary.
                convertToAccurateDouble();
                roundToMagnitude(magnitude, roundingMode, status); // start over
                return;
            }

            // Turn off the approximate double flag, since the value is now confirmed to be exact.
            isApproximate = false;
            origDouble = 0.0;
            origDelta = 0;

            if (position <= 0) {
                // All digits are to the left of the rounding magnitude.
                return;
            }

            // Good to continue rounding.
            if (section == -1) { section = roundingutils::SECTION_LOWER; }
            if (section == -2) { section = roundingutils::SECTION_UPPER; }
        }

        bool roundDown = roundingutils::getRoundingDirection((trailingDigit % 2) == 0,
                isNegative(),
                section,
                roundingMode,
                status);
        if (U_FAILURE(status)) {
            return;
        }

        // Perform truncation
        if (position >= precision) {
            setBcdToZero();
            scale = magnitude;
        } else {
            shiftRight(position);
        }

        // Bubble the result to the higher digits
        if (!roundDown) {
            if (trailingDigit == 9) {
                int bubblePos = 0;
                // Note: in the long implementation, the most digits BCD can have at this point is 15,
                // so bubblePos <= 15 and getDigitPos(bubblePos) is safe.
                for (; getDigitPos(bubblePos) == 9; bubblePos++) {}
                shiftRight(bubblePos); // shift off the trailing 9s
            }
            int8_t digit0 = getDigitPos(0);
            U_ASSERT(digit0 != 9);
            setDigitPos(0, static_cast<int8_t>(digit0 + 1));
            precision += 1; // in case an extra digit got added
        }

        compact();
    }
}